

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O1

void FIX::double_conversion::DoubleToStringConverter::DoubleToAscii
               (double v,DtoaMode mode,int requested_digits,char *buffer,int buffer_length,
               bool *sign,int *length,int *point)

{
  int iVar1;
  bool bVar2;
  uint64_t d64;
  FastDtoaMode mode_00;
  double_conversion *this;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  
  if ((buffer_length != 0) && ((buffer == (char *)0x0 || (buffer_length < 1)))) {
    __assert_fail("len == 0 || (len > 0 && data != __null)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                  ,0xb3,"FIX::double_conversion::Vector<char>::Vector(T *, int) [T = char]");
  }
  if ((~(ulong)v & 0x7ff0000000000000) == 0) {
    __assert_fail("!Double(v).IsSpecial()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x16e,
                  "static void FIX::double_conversion::DoubleToStringConverter::DoubleToAscii(double, DtoaMode, int, char *, int, bool *, int *, int *)"
                 );
  }
  if (requested_digits < 0 && SHORTEST_SINGLE < mode) {
    __assert_fail("mode == SHORTEST || mode == SHORTEST_SINGLE || requested_digits >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x16f,
                  "static void FIX::double_conversion::DoubleToStringConverter::DoubleToAscii(double, DtoaMode, int, char *, int, bool *, int *, int *)"
                 );
  }
  if ((long)v < 0) {
    *sign = true;
    v = -v;
  }
  else {
    *sign = false;
  }
  if (mode == PRECISION && requested_digits == 0) {
    if (0 < buffer_length) {
      *buffer = '\0';
      *length = 0;
      return;
    }
    goto LAB_00169ca0;
  }
  if ((v == 0.0) && (!NAN(v))) {
    if ((0 < buffer_length) && (*buffer = '0', buffer_length != 1)) {
      buffer[1] = '\0';
      *length = 1;
      *point = 1;
      return;
    }
    goto LAB_00169ca0;
  }
  switch(mode) {
  case SHORTEST:
    this = (double_conversion *)0x0;
    break;
  case SHORTEST_SINGLE:
    this = (double_conversion *)0x1;
    break;
  case FIXED:
    buffer_00.length_ = buffer_length;
    buffer_00.start_ = buffer;
    buffer_00._12_4_ = 0;
    bVar2 = FastFixedDtoa(v,requested_digits,buffer_00,length,point);
    goto LAB_00169c58;
  case PRECISION:
    this = (double_conversion *)0x2;
    mode_00 = requested_digits;
    goto LAB_00169c48;
  default:
    goto switchD_00169c1c_default;
  }
  mode_00 = FAST_DTOA_SHORTEST;
LAB_00169c48:
  buffer_01.start_ = (char *)(ulong)(uint)buffer_length;
  buffer_01._8_8_ = length;
  bVar2 = FastDtoa(this,v,mode_00,(int)buffer,buffer_01,point,(int *)v);
LAB_00169c58:
  if (bVar2 == false) {
    if (PRECISION < mode) {
switchD_00169c1c_default:
      abort();
    }
    buffer_02.start_ = (char *)(ulong)(uint)buffer_length;
    buffer_02._8_8_ = length;
    BignumDtoa((double_conversion *)(ulong)mode,v,requested_digits,(int)buffer,buffer_02,point,
               (int *)v);
    iVar1 = *length;
    if (((long)iVar1 < 0) || (buffer_length <= iVar1)) {
LAB_00169ca0:
      __assert_fail("0 <= index && index < length_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                    ,0xca,
                    "T &FIX::double_conversion::Vector<char>::operator[](int) const [T = char]");
    }
    buffer[iVar1] = '\0';
  }
  return;
}

Assistant:

void DoubleToStringConverter::DoubleToAscii(double v,
                                            DtoaMode mode,
                                            int requested_digits,
                                            char* buffer,
                                            int buffer_length,
                                            bool* sign,
                                            int* length,
                                            int* point) {
  Vector<char> vector(buffer, buffer_length);
  ASSERT(!Double(v).IsSpecial());
  ASSERT(mode == SHORTEST || mode == SHORTEST_SINGLE || requested_digits >= 0);

  if (Double(v).Sign() < 0) {
    *sign = true;
    v = -v;
  } else {
    *sign = false;
  }

  if (mode == PRECISION && requested_digits == 0) {
    vector[0] = '\0';
    *length = 0;
    return;
  }

  if (v == 0) {
    vector[0] = '0';
    vector[1] = '\0';
    *length = 1;
    *point = 1;
    return;
  }

  bool fast_worked;
  switch (mode) {
    case SHORTEST:
      fast_worked = FastDtoa(v, FAST_DTOA_SHORTEST, 0, vector, length, point);
      break;
    case SHORTEST_SINGLE:
      fast_worked = FastDtoa(v, FAST_DTOA_SHORTEST_SINGLE, 0,
                             vector, length, point);
      break;
    case FIXED:
      fast_worked = FastFixedDtoa(v, requested_digits, vector, length, point);
      break;
    case PRECISION:
      fast_worked = FastDtoa(v, FAST_DTOA_PRECISION, requested_digits,
                             vector, length, point);
      break;
    default:
      fast_worked = false;
      UNREACHABLE();
  }
  if (fast_worked) return;

  // If the fast dtoa didn't succeed use the slower bignum version.
  BignumDtoaMode bignum_mode = DtoaToBignumDtoaMode(mode);
  BignumDtoa(v, bignum_mode, requested_digits, vector, length, point);
  vector[*length] = '\0';
}